

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers.cpp
# Opt level: O2

void printEvents(istream *input,ostream *output,string *format,string *dateFormat)

{
  Event *event;
  IstreamEntryStream entryStream;
  PrettyPrinter pp;
  EventStream eventStream;
  string sStack_1a8;
  string local_188;
  IstreamEntryStream local_168;
  PrettyPrinter local_140;
  EventStream local_f0;
  
  binlog::IstreamEntryStream::IstreamEntryStream(&local_168,input);
  binlog::EventStream::EventStream(&local_f0);
  std::__cxx11::string::string((string *)&local_188,(string *)format);
  std::__cxx11::string::string((string *)&sStack_1a8,(string *)dateFormat);
  binlog::PrettyPrinter::PrettyPrinter(&local_140,&local_188,&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  while( true ) {
    event = binlog::EventStream::nextEvent(&local_f0,&local_168.super_EntryStream);
    if (event == (Event *)0x0) break;
    binlog::PrettyPrinter::printEvent
              (&local_140,output,event,&local_f0._writerProp,&local_f0._clockSync);
  }
  binlog::PrettyPrinter::~PrettyPrinter(&local_140);
  binlog::EventStream::~EventStream(&local_f0);
  binlog::IstreamEntryStream::~IstreamEntryStream(&local_168);
  return;
}

Assistant:

void printEvents(std::istream& input, std::ostream& output, const std::string& format, const std::string& dateFormat)
{
  binlog::IstreamEntryStream entryStream(input);
  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(format, dateFormat);

  while (const binlog::Event* event = eventStream.nextEvent(entryStream))
  {
    pp.printEvent(output, *event, eventStream.writerProp(), eventStream.clockSync());
  }
}